

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

boolean its_dead(int rx,int ry,int *resp,obj *tobj)

{
  boolean bVar1;
  obj *poVar2;
  trap *ptVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  trap *ttmp;
  obj *otmp;
  obj *tobj_local;
  int *resp_local;
  int ry_local;
  int rx_local;
  
  bVar1 = can_reach_floor();
  if (bVar1 == '\0') {
    ry_local._3_1_ = '\0';
  }
  else if ((((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) ||
          (poVar2 = sobj_at(0x10e,level,rx,ry), poVar2 == (obj *)0x0)) {
    if ((urole.malenum == 0x15e) &&
       ((ttmp = (trap *)sobj_at(0x10e,level,rx,ry), (obj *)ttmp != (obj *)0x0 ||
        (ttmp = (trap *)sobj_at(0x215,level,rx,ry), (obj *)ttmp != (obj *)0x0)))) {
      if (level->objects[rx][ry]->otyp == 0x215) {
        ttmp = (trap *)level->objects[rx][ry];
      }
      if (*(short *)&ttmp[1].field_0x12 == 0x10e) {
        pcVar5 = "that";
        if (rx == u.ux && ry == u.uy) {
          pcVar5 = "this";
        }
        pline("You determine that %s unfortunate being is dead.",pcVar5);
      }
      else {
        ptVar3 = t_at(level,rx,ry);
        pcVar5 = mons_mname(mons + *(int *)&ttmp[3].field_0x8);
        pcVar5 = The(pcVar5);
        bVar6 = false;
        if (ptVar3 != (trap *)0x0) {
          bVar6 = (ptVar3->field_0x8 & 0x1f) == 0x14;
        }
        pcVar4 = "excellent";
        if (bVar6) {
          pcVar4 = "extraordinary";
        }
        pline("%s appears to be in %s health for a statue.",pcVar5,pcVar4);
      }
      ry_local._3_1_ = '\x01';
    }
    else {
      poVar2 = sobj_at(0x10f,level,rx,ry);
      if (poVar2 == (obj *)0x0) {
        poVar2 = sobj_at(0xdc,level,rx,ry);
        if (poVar2 == (obj *)0x0) {
          ry_local._3_1_ = '\0';
        }
        else {
          pick_lock(tobj,rx,ry,'\0','\0');
          ry_local._3_1_ = '\x01';
        }
      }
      else {
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
          if ((moves - poVar2->age < 0x191) && (poVar2->corpsenm != -1)) {
            pcVar5 = mons_mname(mons + poVar2->corpsenm);
            pline("You listen to the egg and guess... %s?",pcVar5);
          }
          else {
            pline("The egg doesn\'t make much noise at all.");
          }
        }
        else {
          pcVar5 = rndmonnam();
          pline("You listen to the egg and guess... %s?",pcVar5);
        }
        ry_local._3_1_ = '\x01';
      }
    }
  }
  else {
    You_hear("a voice say, \"It\'s dead, Jim.\"");
    *resp = 1;
    ry_local._3_1_ = '\x01';
  }
  return ry_local._3_1_;
}

Assistant:

static boolean its_dead(int rx, int ry, int *resp, struct obj *tobj)
{
	struct obj *otmp;
	struct trap *ttmp;

	if (!can_reach_floor()) return FALSE;

	/* additional stethoscope messages from jyoung@apanix.apana.org.au */
	if (Hallucination && sobj_at(CORPSE, level, rx, ry)) {
	    /* (a corpse doesn't retain the monster's sex,
	       so we're forced to use generic pronoun here) */
	    You_hear("a voice say, \"It's dead, Jim.\"");
	    *resp = 1;
	    return TRUE;
	} else if (Role_if (PM_HEALER) && ((otmp = sobj_at(CORPSE, level, rx, ry)) != 0 ||
				    (otmp = sobj_at(STATUE, level, rx, ry)) != 0)) {
	    /* possibly should check uppermost {corpse,statue} in the pile
	       if both types are present, but it's not worth the effort */
	    if (vobj_at(rx, ry)->otyp == STATUE) otmp = vobj_at(rx, ry);
	    if (otmp->otyp == CORPSE) {
		pline("You determine that %s unfortunate being is dead.",
		    (rx == u.ux && ry == u.uy) ? "this" : "that");
	    } else {
		ttmp = t_at(level, rx, ry);
		pline("%s appears to be in %s health for a statue.",
		      The(mons_mname(&mons[otmp->corpsenm])),
		      (ttmp && ttmp->ttyp == STATUE_TRAP) ?
			"extraordinary" : "excellent");
	    }
	    return TRUE;
	}

	/* Listening to eggs is a little fishy, but so is stethoscopes
	   detecting alignment.  The overcomplex wording is because all
	   the monster-naming functions operate on actual instances of
	   the monsters, and we're dealing with just an index so we can
	   avoid things like "a owlbear", etc. */
	if ((otmp = sobj_at(EGG, level, rx, ry))) {
	    if (Hallucination) {
		pline("You listen to the egg and guess... %s?", rndmonnam());
	    } else {
		if (stale_egg(otmp) || otmp->corpsenm == NON_PM) {
		    pline("The egg doesn't make much noise at all.");
		} else {
		    pline("You listen to the egg and guess... %s?",
			  mons_mname(&mons[otmp->corpsenm]));
		}
	    }
	    return TRUE;
	}

	/* Using a stethoscope on a safe may crack the safe open. */
	if ((otmp = sobj_at(IRON_SAFE, level, rx, ry))) {
	    pick_lock(tobj, rx, ry, FALSE, FALSE);
	    return TRUE;
	}

	return FALSE;
}